

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_clearHTSVoiceList(OpenJTalk *oj,HtsVoiceFilelist *list)

{
  undefined8 *in_RSI;
  long in_RDI;
  HtsVoiceFilelist *prev;
  undefined8 *local_18;
  undefined8 *local_10;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    local_18 = (undefined8 *)0x0;
    for (local_10 = in_RSI; local_10 != (undefined8 *)0x0; local_10 = (undefined8 *)*local_10) {
      if (local_18 != (undefined8 *)0x0) {
        free(local_18);
      }
      if (local_10[1] != 0) {
        *(undefined1 *)local_10[1] = 0;
      }
      if (local_10[2] != 0) {
        *(undefined1 *)local_10[2] = 0;
      }
      if (local_10[1] != 0) {
        free((void *)local_10[1]);
      }
      if (local_10[2] != 0) {
        free((void *)local_10[2]);
      }
      local_18 = local_10;
    }
    if (local_18 != (undefined8 *)0x0) {
      free(local_18);
    }
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_clearHTSVoiceList(OpenJTalk *oj, HtsVoiceFilelist *list)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	HtsVoiceFilelist *prev = NULL;

	while (list != NULL)
	{
		if (prev != NULL)
		{
			free(prev);
		}

		if (list->path)
		{
			list->path[0] = '\0';
		}
		if (list->name)
		{
			list->name[0] = '\0';
		}

		if (list->path)
		{
			free(list->path);
		}
		if (list->name)
		{
			free(list->name);
		}

		prev = list;
		list = list->succ;
	}

	if (prev != NULL)
	{
		free(prev);
	}
}